

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::ColladaWriter::writeGeometry(ofstream *out,Scene *scene)

{
  bool bVar1;
  ostream *poVar2;
  reference ppSVar3;
  Mesh *local_58;
  Mesh *mesh;
  SceneObject *o;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  int nMeshes;
  Scene *scene_local;
  ofstream *out_local;
  
  __range2._4_4_ = 0;
  poVar2 = std::operator<<((ostream *)out,"   <library_geometries>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __end2 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(&scene->objects);
  o = (SceneObject *)
      std::
      set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
      ::end(&scene->objects);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&o);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end2);
    if (*ppSVar3 == (SceneObject *)0x0) {
      local_58 = (Mesh *)0x0;
    }
    else {
      local_58 = (Mesh *)__dynamic_cast(*ppSVar3,&DynamicScene::SceneObject::typeinfo,
                                        &DynamicScene::Mesh::typeinfo,0);
    }
    if (local_58 != (Mesh *)0x0) {
      __range2._4_4_ = __range2._4_4_ + 1;
      writeMesh(out,local_58,__range2._4_4_);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2);
  }
  poVar2 = std::operator<<((ostream *)out,"   </library_geometries>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ColladaWriter::writeGeometry( ofstream& out, DynamicScene::Scene& scene )
{
   int nMeshes = 0;

   out << "   <library_geometries>" << endl;
   for( auto o : scene.objects )
   {
      DynamicScene::Mesh* mesh = dynamic_cast<DynamicScene::Mesh*>( o );
      if( mesh )
      {
         nMeshes++;
         writeMesh( out, mesh, nMeshes );
      }

   }
   out << "   </library_geometries>" << endl;
}